

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChNodeFEAxyzDD::ChNodeFEAxyzDD
          (ChNodeFEAxyzDD *this,ChVector<double> *initial_pos,ChVector<double> *initial_dir,
          ChVector<double> *initial_curv)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ChVariablesGenericDiagonalMass *this_00;
  ChVector<double> local_50;
  ChVector<double> local_38;
  
  ChNodeBase::ChNodeBase((ChNodeBase *)&this->field_0x188);
  *(undefined ***)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase.field_0x18 =
       &PTR__ChLoadable_00b2c638;
  local_38.m_data[0] = initial_pos->m_data[0];
  local_38.m_data[1] = initial_pos->m_data[1];
  local_38.m_data[2] = initial_pos->m_data[2];
  local_50.m_data[0] = initial_dir->m_data[0];
  local_50.m_data[1] = initial_dir->m_data[1];
  local_50.m_data[2] = initial_dir->m_data[2];
  ChNodeFEAxyzD::ChNodeFEAxyzD
            (&this->super_ChNodeFEAxyzD,&PTR_construction_vtable_32__00b56560,&local_38,&local_50);
  (this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase._vptr_ChNodeFEAbase =
       (_func_int **)0xb56108;
  *(undefined8 *)&this->field_0x188 = 0xb564a0;
  *(undefined8 *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase.field_0x18 =
       0xb56300;
  (this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChVariableTupleCarrier_1vars<3>.
  _vptr_ChVariableTupleCarrier_1vars = (_func_int **)(vtable + 0x2e0);
  *(double *)&(this->super_ChNodeFEAxyzD).field_0x140 = initial_curv->m_data[0];
  *(double *)&this->field_0x148 = initial_curv->m_data[1];
  *(double *)&this->field_0x150 = initial_curv->m_data[2];
  dVar2 = VNULL;
  (this->DD_dt).m_data[0] = VNULL;
  dVar3 = DAT_00b90ac0;
  (this->DD_dt).m_data[1] = DAT_00b90ac0;
  dVar4 = DAT_00b90ac8;
  (this->DD_dt).m_data[2] = DAT_00b90ac8;
  (this->DD_dtdt).m_data[0] = dVar2;
  (this->DD_dtdt).m_data[1] = dVar3;
  (this->DD_dtdt).m_data[2] = dVar4;
  this_00 = (ChVariablesGenericDiagonalMass *)::operator_new(0x50);
  ChVariablesGenericDiagonalMass::ChVariablesGenericDiagonalMass(this_00,3);
  *(ChVariablesGenericDiagonalMass **)&(this->super_ChNodeFEAxyzD).field_0x138 = this_00;
  lVar1 = (this_00->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows;
  if (-1 < lVar1) {
    if (lVar1 != 0) {
      memset((this_00->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data,0,lVar1 << 3);
    }
    return;
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

ChNodeFEAxyzDD::ChNodeFEAxyzDD(ChVector<> initial_pos, ChVector<> initial_dir, ChVector<> initial_curv)
    : ChNodeFEAxyzD(initial_pos, initial_dir), DD(initial_curv), DD_dt(VNULL), DD_dtdt(VNULL) {
    variables_DD = new ChVariablesGenericDiagonalMass(3);
    // default: no atomic mass associated to fea node, the fea element will add mass matrix
    variables_DD->GetMassDiagonal().setZero();
}